

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O3

Dec_Graph_t * Abc_ManResubQuit0(Abc_Obj_t *pRoot,Abc_Obj_t *pObj)

{
  Dec_Edge_t DVar1;
  Dec_Graph_t *pDVar2;
  Dec_Node_t *pDVar3;
  
  pDVar2 = (Dec_Graph_t *)calloc(1,0x20);
  pDVar2->nLeaves = 1;
  pDVar2->nSize = 1;
  pDVar2->nCap = 0x34;
  pDVar3 = (Dec_Node_t *)malloc(0x4e0);
  pDVar2->pNodes = pDVar3;
  pDVar3->eEdge0 = (Dec_Edge_t)0x0;
  pDVar3->eEdge1 = (Dec_Edge_t)0x0;
  (pDVar3->field_2).pFunc = (void *)0x0;
  *(undefined8 *)&pDVar3->field_0x10 = 0;
  (pDVar3->field_2).pFunc = pObj;
  DVar1 = (Dec_Edge_t)(*(uint *)&pObj->field_0x14 >> 7 & 1);
  pDVar2->eRoot = DVar1;
  if ((pRoot->field_0x14 & 0x80) != 0) {
    pDVar2->eRoot = (Dec_Edge_t)((uint)DVar1 ^ 1);
  }
  return pDVar2;
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit0( Abc_Obj_t * pRoot, Abc_Obj_t * pObj )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot;
    pGraph = Dec_GraphCreate( 1 );
    Dec_GraphNode( pGraph, 0 )->pFunc = pObj;
    eRoot = Dec_EdgeCreate( 0, pObj->fPhase );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}